

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VGetLength(N_Vector W,int myid)

{
  long lVar1;
  double dVar2;
  
  if ((W->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) ||
     (W->ops->nvdotprod == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) {
    printf(">>> FAILED test -- N_VGetLength, Proc %d missing required operations\n",myid);
  }
  else {
    lVar1 = N_VGetLength();
    N_VConst(0x3ff0000000000000,W);
    dVar2 = (double)N_VDotProd(W,W);
    sync_device(W);
    if (lVar1 == (long)dVar2) {
      if (myid != 0) {
        return 0;
      }
      puts("PASSED test -- N_VGetLength");
      return 0;
    }
    printf(">>> FAILED test -- N_VGetLength, Proc %d (%li != %li)\n",myid,lVar1,(long)dVar2);
  }
  return 1;
}

Assistant:

int Test_N_VGetLength(N_Vector W, int myid)
{
  sunindextype Wlength, Wlength2;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL || W->ops->nvdotprod == NULL)
  {
    printf(">>> FAILED test -- N_VGetLength, Proc %d missing required "
           "operations\n",
           myid);
    return (1);
  }

  /* ask W for it's overall length */
  Wlength = N_VGetLength(W);

  /* use N_VConst and N_VDotProd to compute length */
  N_VConst(SUN_RCONST(1.0), W);
  Wlength2 = (sunindextype)N_VDotProd(W, W);
  sync_device(W);

  /* return error if lengths disagree */
  if (Wlength != Wlength2)
  {
    printf(">>> FAILED test -- N_VGetLength, Proc %d (%li != %li)\n", myid,
           (long int)Wlength, (long int)Wlength2);
    return (1);
  }
  if (myid == 0) { printf("PASSED test -- N_VGetLength\n"); }
  return (0);
}